

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O1

dropt_context * dropt_new_context(dropt_option *options)

{
  _Bool _Var1;
  char *pcVar2;
  dropt_context *pdVar3;
  dropt_context *extraout_RAX;
  dropt_context *extraout_RAX_00;
  code *in_RSI;
  dropt_context *option;
  size_t sVar4;
  
  pdVar3 = (dropt_context *)options;
  if (options == (dropt_option *)0x0) {
LAB_0010309b:
    dropt_new_context_cold_2();
    if (pdVar3 == (dropt_context *)0x0) {
      dropt_set_strncmp_cold_1();
      dropt_clear_error(pdVar3);
      if (pdVar3 != (dropt_context *)0x0) {
        free(pdVar3->sortedByLong);
        pdVar3->sortedByLong = (option_proxy *)0x0;
        free(pdVar3->sortedByShort);
        pdVar3->sortedByShort = (option_proxy *)0x0;
      }
      free(pdVar3);
      return extraout_RAX_00;
    }
    if (in_RSI == (dropt_strncmp_func)0x0) {
      in_RSI = strncmp;
    }
    pdVar3->ncmpstr = in_RSI;
    free(pdVar3->sortedByLong);
    pdVar3->sortedByLong = (option_proxy *)0x0;
    free(pdVar3->sortedByShort);
    pdVar3->sortedByShort = (option_proxy *)0x0;
    return extraout_RAX;
  }
  _Var1 = is_valid_option(options);
  if (_Var1) {
    option = (dropt_context *)(options + 1);
    sVar4 = 0;
    do {
      if (option[-1].allowConcatenatedArgs == true) {
LAB_00103096:
        dropt_new_context_cold_1();
        goto LAB_0010309b;
      }
      pdVar3 = (dropt_context *)option[-1].errorHandler;
      if (pdVar3 != (dropt_context *)0x0) {
        in_RSI = (dropt_strncmp_func)0x3d;
        pcVar2 = strchr((char *)pdVar3,0x3d);
        if (pcVar2 != (char *)0x0) goto LAB_00103096;
      }
      sVar4 = sVar4 + 1;
      pdVar3 = option;
      _Var1 = is_valid_option((dropt_option *)option);
      option = (dropt_context *)&(option->errorDetails).optionName;
    } while (_Var1);
  }
  else {
    sVar4 = 0;
  }
  pdVar3 = (dropt_context *)malloc(0x60);
  if (pdVar3 == (dropt_context *)0x0) {
    pdVar3 = (dropt_context *)0x0;
  }
  else {
    pdVar3->options = (dropt_option *)0x0;
    pdVar3->numOptions = 0;
    (pdVar3->errorDetails).message = (dropt_char *)0x0;
    pdVar3->ncmpstr = (dropt_strncmp_func)0x0;
    pdVar3->sortedByLong = (option_proxy *)0x0;
    pdVar3->sortedByShort = (option_proxy *)0x0;
    (pdVar3->errorDetails).optionName = (dropt_char *)0x0;
    (pdVar3->errorDetails).optionArgument = (dropt_char *)0x0;
    pdVar3->errorHandlerData = (void *)0x0;
    *(undefined8 *)&pdVar3->errorDetails = 0;
    *(undefined8 *)&pdVar3->allowConcatenatedArgs = 0;
    pdVar3->errorHandler = (dropt_error_handler_func)0x0;
    pdVar3->options = options;
    pdVar3->numOptions = sVar4;
    pdVar3->ncmpstr = strncmp;
    free(pdVar3->sortedByLong);
    pdVar3->sortedByLong = (option_proxy *)0x0;
    free(pdVar3->sortedByShort);
    pdVar3->sortedByShort = (option_proxy *)0x0;
  }
  return pdVar3;
}

Assistant:

dropt_context*
dropt_new_context(const dropt_option* options)
{
    dropt_context* context = NULL;
    size_t n;

    if (options == NULL)
    {
        DROPT_MISUSE("No option list specified.");
        goto exit;
    }

    /* Sanity-check the options. */
    for (n = 0; is_valid_option(&options[n]); n++)
    {
        if (   options[n].short_name == DROPT_TEXT_LITERAL('=')
            || (   options[n].long_name != NULL
                && dropt_strchr(options[n].long_name, DROPT_TEXT_LITERAL('=')) != NULL))
        {
            DROPT_MISUSE("Invalid option list. '=' may not be used in an option name.");
            goto exit;
        }
    }

    context = malloc(sizeof *context);
    if (context == NULL)
    {
        goto exit;
    }
    else
    {
        dropt_context emptyContext = { 0 };
        *context = emptyContext;

        context->options = options;
        context->numOptions = n;
        dropt_set_strncmp(context, NULL);
    }

exit:
    return context;
}